

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_6_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  float *data;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  float *pfVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  ulong uVar49;
  int iVar50;
  float *pfVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  int k_count;
  int scale;
  long lVar58;
  int iVar59;
  int iVar60;
  float *pfVar61;
  byte bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 auVar97 [12];
  undefined1 auVar96 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  undefined1 auVar101 [64];
  int c2;
  int data_width;
  float *local_160;
  int local_150;
  float *local_128;
  float local_f8;
  
  auVar71._8_4_ = 0x3effffff;
  auVar71._0_8_ = 0x3effffff3effffff;
  auVar71._12_4_ = 0x3effffff;
  auVar96 = ZEXT1664(auVar71);
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  fVar77 = ipoint->scale;
  auVar101 = ZEXT464((uint)fVar77);
  auVar63 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)fVar77),auVar70,0xf8);
  auVar63 = ZEXT416((uint)(fVar77 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  fVar75 = -0.08 / (fVar77 * fVar77);
  scale = (int)auVar63._0_4_;
  auVar64._0_4_ = (int)auVar63._0_4_;
  auVar64._4_4_ = (int)auVar63._4_4_;
  auVar64._8_4_ = (int)auVar63._8_4_;
  auVar64._12_4_ = (int)auVar63._12_4_;
  auVar63 = vcvtdq2ps_avx(auVar64);
  auVar64 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)ipoint->x),auVar70,0xf8);
  auVar64 = ZEXT416((uint)(ipoint->x + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65._0_8_ = (double)auVar64._0_4_;
  auVar65._8_8_ = auVar64._8_8_;
  auVar69._0_8_ = (double)fVar77;
  auVar69._8_8_ = 0;
  auVar64 = vfmadd231sd_fma(auVar65,auVar69,ZEXT816(0x3fe0000000000000));
  auVar68._0_4_ = (float)auVar64._0_8_;
  auVar68._4_12_ = auVar64._4_12_;
  auVar64 = vpternlogd_avx512vl(auVar71,ZEXT416((uint)ipoint->y),auVar70,0xf8);
  fVar5 = auVar68._0_4_ - auVar63._0_4_;
  auVar64 = ZEXT416((uint)(ipoint->y + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar66._0_8_ = (double)auVar64._0_4_;
  auVar66._8_8_ = auVar64._8_8_;
  auVar64 = vfmadd231sd_fma(auVar66,auVar69,ZEXT816(0x3fe0000000000000));
  auVar67._0_4_ = (float)auVar64._0_8_;
  auVar67._4_12_ = auVar64._4_12_;
  fVar100 = auVar67._0_4_ - auVar63._0_4_;
  auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar77),auVar68);
  auVar64 = vpternlogd_avx512vl(auVar71,auVar63,auVar70,0xf8);
  auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = ZEXT416((uint)fVar77);
  if (scale < (int)auVar63._0_4_) {
    auVar72._8_4_ = 0x3effffff;
    auVar72._0_8_ = 0x3effffff3effffff;
    auVar72._12_4_ = 0x3effffff;
    auVar73._8_4_ = 0x80000000;
    auVar73._0_8_ = 0x8000000080000000;
    auVar73._12_4_ = 0x80000000;
    auVar63 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar64,auVar67);
    auVar65 = vpternlogd_avx512vl(auVar73,auVar63,auVar72,0xea);
    auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
    auVar63 = vroundss_avx(auVar63,auVar63,0xb);
    if (scale < (int)auVar63._0_4_) {
      auVar63 = vfmadd231ss_fma(auVar68,auVar64,ZEXT416(0x41300000));
      auVar74._8_4_ = 0x80000000;
      auVar74._0_8_ = 0x8000000080000000;
      auVar74._12_4_ = 0x80000000;
      auVar65 = vpternlogd_avx512vl(auVar74,auVar63,auVar72,0xea);
      auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
      auVar63 = vroundss_avx(auVar63,auVar63,0xb);
      if ((int)auVar63._0_4_ + scale <= iimage->width) {
        auVar63 = vfmadd231ss_fma(auVar67,auVar64,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar65 = vpternlogd_avx512vl(auVar72,auVar63,auVar15,0xf8);
        auVar63 = ZEXT416((uint)(auVar63._0_4_ + auVar65._0_4_));
        auVar63 = vroundss_avx(auVar63,auVar63,0xb);
        if ((int)auVar63._0_4_ + scale <= iimage->height) {
          pfVar45 = iimage->data;
          iVar31 = scale * 2;
          fVar5 = fVar5 + 0.5;
          iVar2 = iimage->data_width;
          local_128 = haarResponseX + 0x1d;
          local_160 = haarResponseY + 0x1d;
          uVar22 = 0xfffffff4;
          do {
            auVar63._0_4_ = (float)(int)uVar22;
            auVar63._4_12_ = in_ZMM8._4_12_;
            auVar93._0_4_ = (float)(int)(uVar22 | 1);
            auVar93._4_12_ = in_ZMM8._4_12_;
            auVar63 = vfmadd213ss_fma(auVar63,auVar64,ZEXT416((uint)(fVar100 + 0.5)));
            auVar65 = vfmadd213ss_fma(auVar93,auVar64,ZEXT416((uint)(fVar100 + 0.5)));
            iVar19 = (int)auVar63._0_4_;
            iVar26 = (int)auVar65._0_4_;
            iVar20 = (iVar19 + -1) * iVar2;
            iVar21 = (iVar19 + -1 + iVar31) * iVar2;
            iVar27 = (iVar19 + -1 + scale) * iVar2;
            iVar19 = (iVar26 + -1 + iVar31) * iVar2;
            lVar34 = 0;
            iVar28 = (iVar26 + -1) * iVar2;
            iVar26 = (iVar26 + -1 + scale) * iVar2;
            do {
              iVar29 = (int)lVar34;
              auVar86._0_4_ = (float)(iVar29 + -0xc);
              auVar97 = auVar96._4_12_;
              auVar86._4_12_ = auVar97;
              auVar63 = vfmadd213ss_fma(auVar86,auVar64,ZEXT416((uint)fVar5));
              iVar38 = (int)auVar63._0_4_;
              auVar87._0_4_ = (float)(iVar29 + -0xb);
              auVar87._4_12_ = auVar97;
              auVar63 = vfmadd213ss_fma(auVar87,auVar64,ZEXT416((uint)fVar5));
              iVar40 = iVar38 + -1 + scale;
              iVar41 = iVar38 + -1 + iVar31;
              iVar56 = (int)auVar63._0_4_;
              auVar88._0_4_ = (float)(iVar29 + -10);
              auVar88._4_12_ = auVar97;
              auVar65 = ZEXT416((uint)fVar5);
              auVar63 = vfmadd213ss_fma(auVar88,auVar64,auVar65);
              iVar36 = (int)auVar63._0_4_;
              auVar89._0_4_ = (float)(iVar29 + -9);
              auVar89._4_12_ = auVar97;
              auVar63 = vfmadd213ss_fma(auVar89,auVar64,auVar65);
              iVar37 = (int)auVar63._0_4_;
              auVar90._0_4_ = (float)(iVar29 + -8);
              auVar90._4_12_ = auVar97;
              auVar63 = vfmadd213ss_fma(auVar90,auVar64,auVar65);
              iVar59 = (int)auVar63._0_4_;
              auVar91._0_4_ = (float)(iVar29 + -7);
              auVar91._4_12_ = auVar97;
              auVar63 = vfmadd213ss_fma(auVar91,auVar64,auVar65);
              fVar77 = pfVar45[iVar21 + -1 + iVar38];
              fVar76 = pfVar45[iVar20 + iVar41];
              iVar42 = iVar56 + -1 + scale;
              iVar52 = iVar56 + -1 + iVar31;
              auVar67 = SUB6416(ZEXT464(0x40000000),0);
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar40] -
                                                      pfVar45[iVar21 + iVar40])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar41] -
                                                      pfVar45[iVar20 + -1 + iVar38])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar38] -
                                                      pfVar45[iVar27 + iVar41])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar41] -
                                                      pfVar45[iVar20 + -1 + iVar38])));
              local_128[lVar34 + -0x1d] = (fVar77 - fVar76) + auVar65._0_4_;
              local_160[lVar34 + -0x1d] = auVar66._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar21 + -1 + iVar56];
              fVar76 = pfVar45[iVar20 + iVar52];
              iVar43 = iVar36 + -1 + scale;
              iVar60 = iVar36 + -1 + iVar31;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar42] -
                                                      pfVar45[iVar21 + iVar42])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar52] -
                                                      pfVar45[iVar20 + -1 + iVar56])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar56] -
                                                      pfVar45[iVar27 + iVar52])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar52] -
                                                      pfVar45[iVar20 + -1 + iVar56])));
              local_128[lVar34 + -0x1c] = (fVar77 - fVar76) + auVar65._0_4_;
              local_160[lVar34 + -0x1c] = auVar66._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar21 + -1 + iVar36];
              fVar76 = pfVar45[iVar20 + iVar60];
              iVar39 = iVar37 + -1 + iVar31;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar36] -
                                                      pfVar45[iVar27 + iVar60])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar60] -
                                                      pfVar45[iVar20 + -1 + iVar36])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar43] -
                                                      pfVar45[iVar21 + iVar43])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar60] -
                                                      pfVar45[iVar20 + -1 + iVar36])));
              local_128[lVar34 + -0x1b] = (fVar77 - fVar76) + auVar66._0_4_;
              local_160[lVar34 + -0x1b] = auVar65._0_4_ - (fVar77 - fVar76);
              iVar55 = iVar37 + -1 + scale;
              fVar77 = pfVar45[iVar21 + -1 + iVar37];
              fVar76 = pfVar45[iVar20 + iVar39];
              iVar54 = iVar59 + -1 + scale;
              iVar50 = iVar59 + -1 + iVar31;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar55] -
                                                      pfVar45[iVar21 + iVar55])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar39] -
                                                      pfVar45[iVar20 + -1 + iVar37])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar37] -
                                                      pfVar45[iVar27 + iVar39])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar39] -
                                                      pfVar45[iVar20 + -1 + iVar37])));
              local_128[lVar34 + -0x1a] = (fVar77 - fVar76) + auVar65._0_4_;
              local_160[lVar34 + -0x1a] = auVar66._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar21 + -1 + iVar59];
              fVar80 = pfVar45[iVar21 + iVar50] - pfVar45[iVar20 + -1 + iVar59];
              auVar96 = ZEXT464((uint)fVar80);
              fVar76 = pfVar45[iVar20 + iVar50];
              iVar23 = (int)auVar63._0_4_;
              iVar48 = iVar23 + -1 + scale;
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar54] -
                                                      pfVar45[iVar21 + iVar54])),auVar67,
                                        ZEXT416((uint)fVar80));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar59] -
                                                      pfVar45[iVar27 + iVar50])),auVar67,
                                        ZEXT416((uint)fVar80));
              local_128[lVar34 + -0x19] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -0x19] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar21 + -1 + iVar23];
              iVar53 = iVar23 + -1 + iVar31;
              fVar76 = pfVar45[iVar20 + iVar53];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar20 + iVar48] -
                                                      pfVar45[iVar21 + iVar48])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar53] -
                                                      pfVar45[iVar20 + -1 + iVar23])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar27 + -1 + iVar23] -
                                                      pfVar45[iVar27 + iVar53])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar21 + iVar53] -
                                                      pfVar45[iVar20 + -1 + iVar23])));
              local_128[lVar34 + -0x18] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -0x18] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar38];
              fVar76 = pfVar45[iVar28 + iVar41];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar40] -
                                                      pfVar45[iVar40 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar41 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar38])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar38] -
                                                      pfVar45[iVar26 + iVar41])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar41 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar38])));
              local_128[lVar34 + -5] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -5] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar56];
              fVar76 = pfVar45[iVar28 + iVar52];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar42] -
                                                      pfVar45[iVar42 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar52 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar56])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar56] -
                                                      pfVar45[iVar26 + iVar52])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar52 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar56])));
              local_128[lVar34 + -4] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -4] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar36];
              fVar76 = pfVar45[iVar28 + iVar60];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar43] -
                                                      pfVar45[iVar43 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar60 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar36])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar36] -
                                                      pfVar45[iVar26 + iVar60])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar60 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar36])));
              local_128[lVar34 + -3] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -3] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar37];
              fVar76 = pfVar45[iVar28 + iVar39];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar55] -
                                                      pfVar45[iVar55 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar39 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar37])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar37] -
                                                      pfVar45[iVar26 + iVar39])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar39 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar37])));
              local_128[lVar34 + -2] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -2] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar59];
              fVar76 = pfVar45[iVar28 + iVar50];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar54] -
                                                      pfVar45[iVar54 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar50 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar59])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar59] -
                                                      pfVar45[iVar26 + iVar50])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar50 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar59])));
              local_128[lVar34 + -1] = (fVar77 - fVar76) + auVar63._0_4_;
              local_160[lVar34 + -1] = auVar65._0_4_ - (fVar77 - fVar76);
              fVar77 = pfVar45[iVar19 + -1 + iVar23];
              fVar76 = pfVar45[iVar28 + iVar53];
              auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar26 + -1 + iVar23] -
                                                      pfVar45[iVar26 + iVar53])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar53 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar23])));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar45[iVar28 + iVar48] -
                                                      pfVar45[iVar48 + iVar19])),auVar67,
                                        ZEXT416((uint)(pfVar45[iVar53 + iVar19] -
                                                      pfVar45[iVar28 + -1 + iVar23])));
              local_128[lVar34] = (fVar77 - fVar76) + auVar65._0_4_;
              local_160[lVar34] = auVar63._0_4_ - (fVar77 - fVar76);
              lVar34 = lVar34 + 6;
            } while (iVar29 + -0xc < 6);
            local_160 = local_160 + 0x30;
            local_128 = local_128 + 0x30;
            bVar4 = (int)uVar22 < 10;
            uVar22 = uVar22 + 2;
          } while (bVar4);
          goto LAB_001bbe0c;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar34 = 0;
  uVar22 = 0xfffffff4;
  do {
    auVar78._0_4_ = (float)(int)uVar22;
    auVar78._4_12_ = in_ZMM8._4_12_;
    auVar81._0_4_ = (float)(int)(uVar22 | 1);
    auVar81._4_12_ = in_ZMM8._4_12_;
    auVar63 = vfmadd213ss_fma(auVar78,auVar101._0_16_,ZEXT416((uint)fVar100));
    auVar65 = vfmadd213ss_fma(auVar81,auVar101._0_16_,ZEXT416((uint)fVar100));
    fVar76 = auVar63._0_4_;
    fVar80 = auVar65._0_4_;
    iVar20 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
    iVar26 = iVar2 + iVar20;
    iVar27 = iVar20 + -1;
    iVar28 = iVar20 + -1 + scale;
    iVar21 = iVar2 + -1 + iVar20;
    iVar59 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
    iVar36 = iVar2 + iVar59;
    iVar19 = iVar2 + -1 + iVar59;
    iVar29 = iVar59 + -1;
    iVar37 = iVar59 + -1 + scale;
    pfVar45 = haarResponseX;
    pfVar61 = haarResponseY;
    lVar33 = lVar34;
    iVar31 = -0xc;
    do {
      auVar79._0_4_ = (float)iVar31;
      auVar79._4_12_ = in_ZMM8._4_12_;
      auVar63 = vfmadd213ss_fma(auVar79,auVar101._0_16_,ZEXT416((uint)fVar5));
      auVar94._0_4_ = (float)(iVar31 + 1);
      auVar94._4_12_ = in_ZMM8._4_12_;
      auVar65 = vfmadd213ss_fma(auVar94,auVar101._0_16_,ZEXT416((uint)fVar5));
      fVar80 = auVar65._0_4_;
      fVar76 = auVar63._0_4_;
      iVar48 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      if (((iVar20 < 1) || (iVar48 < 1)) || (iimage->height < iVar26)) {
LAB_001baf10:
        haarXY(iimage,iVar20,iVar48,scale,(float *)((long)pfVar45 + lVar33),
               (float *)((long)pfVar61 + lVar33));
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar23 = iimage->width;
        iVar38 = iVar2 + iVar48;
        if (iVar23 < iVar38) goto LAB_001baf10;
        iVar41 = iVar48 + -1 + scale;
        iVar39 = iimage->data_width;
        pfVar51 = iimage->data;
        iVar42 = iVar39 * iVar27;
        iVar40 = iVar39 * iVar21;
        fVar76 = pfVar51[iVar40 + -1 + iVar48];
        fVar6 = pfVar51[iVar42 + -1 + iVar38];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar42 + iVar41] - pfVar51[iVar40 + iVar41]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar51[iVar40 + -1 + iVar38] -
                                                pfVar51[iVar42 + -1 + iVar48])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar51[iVar39 * iVar28 + -1 + iVar48] -
                                                pfVar51[iVar39 * iVar28 + -1 + iVar38])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar51[iVar40 + -1 + iVar38] -
                                                pfVar51[iVar42 + -1 + iVar48])));
        *(float *)((long)pfVar45 + lVar33) = (fVar76 - fVar6) + auVar63._0_4_;
        *(float *)((long)pfVar61 + lVar33) = auVar65._0_4_ - (fVar76 - fVar6);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 4);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 4);
      iVar38 = (int)((double)((ulong)(0.0 <= fVar80) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar80) * -0x4020000000000000) + (double)fVar80);
      if (((iVar20 < 1) || (iVar38 < 1)) ||
         ((iimage->height < iVar26 || (iVar39 = iVar2 + iVar38, iVar23 < iVar39)))) {
        haarXY(iimage,iVar20,iVar38,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar42 = iVar38 + -1 + scale;
        iVar41 = iVar40 * iVar27;
        iVar43 = iVar40 * iVar21;
        fVar76 = pfVar3[iVar43 + -1 + iVar38];
        fVar80 = pfVar3[iVar41 + -1 + iVar39];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar41 + iVar42] - pfVar3[iVar43 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar39] -
                                                pfVar3[iVar41 + -1 + iVar38])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar28 + -1 + iVar38] -
                                                pfVar3[iVar40 * iVar28 + -1 + iVar39])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar39] -
                                                pfVar3[iVar41 + -1 + iVar38])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      auVar63 = vpbroadcastd_avx512vl();
      auVar63 = vpaddd_avx(auVar63,_DAT_00599790);
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 8);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 8);
      auVar63 = vcvtdq2ps_avx(auVar63);
      auVar17._4_4_ = fVar5;
      auVar17._0_4_ = fVar5;
      auVar17._8_4_ = fVar5;
      auVar17._12_4_ = fVar5;
      auVar18._4_4_ = fVar77;
      auVar18._0_4_ = fVar77;
      auVar18._8_4_ = fVar77;
      auVar18._12_4_ = fVar77;
      auVar65 = vfmadd132ps_fma(auVar63,auVar17,auVar18);
      auVar63 = vshufps_avx(auVar65,auVar65,0xff);
      uVar24 = vcmpps_avx512vl(auVar65,_DAT_00599190,0xd);
      bVar62 = (byte)(uVar24 >> 3);
      iVar39 = (int)((double)((ulong)(bVar62 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      if (((iVar20 < 1) || (iVar39 < 1)) ||
         ((iimage->height < iVar26 || (iVar40 = iVar2 + iVar39, iVar23 < iVar40)))) {
        haarXY(iimage,iVar20,iVar39,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar41 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar55 = iVar39 + -1 + scale;
        iVar43 = iVar41 * iVar27;
        iVar42 = iVar41 * iVar21;
        fVar76 = pfVar3[iVar42 + -1 + iVar39];
        fVar80 = pfVar3[iVar43 + -1 + iVar40];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar55] - pfVar3[iVar42 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar40] -
                                                pfVar3[iVar43 + -1 + iVar39])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar41 * iVar28 + -1 + iVar39] -
                                                pfVar3[iVar41 * iVar28 + -1 + iVar40])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar40] -
                                                pfVar3[iVar43 + -1 + iVar39])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar66._0_4_ - (fVar76 - fVar80);
      }
      auVar63 = vpermilpd_avx(auVar65,1);
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0xc);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0xc);
      bVar62 = (byte)uVar24;
      iVar40 = (int)((double)((ulong)(bVar62 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      if ((((iVar20 < 1) || (iVar40 < 1)) || (iimage->height < iVar26)) ||
         (iVar41 = iVar2 + iVar40, iVar23 < iVar41)) {
        haarXY(iimage,iVar20,iVar40,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar42 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar54 = iVar40 + -1 + scale;
        iVar55 = iVar42 * iVar27;
        iVar43 = iVar42 * iVar21;
        fVar76 = pfVar3[iVar43 + -1 + iVar40];
        fVar80 = pfVar3[iVar55 + -1 + iVar41];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar55 + iVar54] - pfVar3[iVar43 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar41] -
                                                pfVar3[iVar55 + -1 + iVar40])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 * iVar28 + -1 + iVar40] -
                                                pfVar3[iVar42 * iVar28 + -1 + iVar41])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar41] -
                                                pfVar3[iVar55 + -1 + iVar40])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar66._0_4_ - (fVar76 - fVar80);
      }
      auVar63 = vmovshdup_avx(auVar65);
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x10);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x10);
      iVar41 = (int)((double)((ulong)(bVar62 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar63._0_4_);
      if (((iVar20 < 1) || (iVar41 < 1)) ||
         ((iimage->height < iVar26 || (iVar42 = iVar2 + iVar41, iVar23 < iVar42)))) {
        haarXY(iimage,iVar20,iVar41,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar43 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar53 = iVar41 + -1 + scale;
        iVar55 = iVar43 * iVar27;
        iVar54 = iVar43 * iVar21;
        fVar76 = pfVar3[iVar54 + -1 + iVar41];
        fVar80 = pfVar3[iVar55 + -1 + iVar42];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar55 + iVar53] - pfVar3[iVar54 + iVar53]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar54 + -1 + iVar42] -
                                                pfVar3[iVar55 + -1 + iVar41])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 * iVar28 + -1 + iVar41] -
                                                pfVar3[iVar43 * iVar28 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar54 + -1 + iVar42] -
                                                pfVar3[iVar55 + -1 + iVar41])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar66._0_4_ - (fVar76 - fVar80);
      }
      local_f8 = auVar65._0_4_;
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x14);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x14);
      iVar42 = (int)((double)((ulong)(bVar62 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar62 & 1) * -0x4020000000000000) + (double)local_f8);
      if (((iVar20 < 1) || (iVar42 < 1)) ||
         ((iimage->height < iVar26 || (iVar43 = iVar2 + iVar42, iVar23 < iVar43)))) {
        haarXY(iimage,iVar20,iVar42,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar55 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar52 = iVar42 + -1 + scale;
        iVar54 = iVar55 * iVar27;
        iVar53 = iVar55 * iVar21;
        fVar76 = pfVar3[iVar53 + -1 + iVar42];
        fVar80 = pfVar3[iVar54 + -1 + iVar43];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar54 + iVar52] - pfVar3[iVar53 + iVar52]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar53 + -1 + iVar43] -
                                                pfVar3[iVar54 + -1 + iVar42])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar55 * iVar28 + -1 + iVar42] -
                                                pfVar3[iVar55 * iVar28 + -1 + iVar43])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar53 + -1 + iVar43] -
                                                pfVar3[iVar54 + -1 + iVar42])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x60);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x60);
      if ((((iVar59 < 1) || (iVar48 < 1)) || (iimage->height < iVar36)) ||
         (iVar43 = iVar2 + iVar48, iVar23 < iVar43)) {
        haarXY(iimage,iVar59,iVar48,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar55 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar54 = iVar48 + -1 + scale;
        iVar52 = iVar55 * iVar29;
        iVar53 = iVar55 * iVar19;
        fVar76 = pfVar3[iVar53 + -1 + iVar48];
        fVar80 = pfVar3[iVar52 + -1 + iVar43];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar52 + iVar54] - pfVar3[iVar53 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar53 + -1 + iVar43] -
                                                pfVar3[iVar52 + -1 + iVar48])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar55 * iVar37 + -1 + iVar48] -
                                                pfVar3[iVar55 * iVar37 + -1 + iVar43])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar53 + -1 + iVar43] -
                                                pfVar3[iVar52 + -1 + iVar48])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 100);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 100);
      if (((iVar59 < 1) || (iVar38 < 1)) ||
         ((iimage->height < iVar36 || (iVar48 = iVar2 + iVar38, iVar23 < iVar48)))) {
        haarXY(iimage,iVar59,iVar38,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar43 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar55 = iVar38 + -1 + scale;
        iVar53 = iVar43 * iVar29;
        iVar54 = iVar43 * iVar19;
        fVar76 = pfVar3[iVar54 + -1 + iVar38];
        fVar80 = pfVar3[iVar53 + -1 + iVar48];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar53 + iVar55] - pfVar3[iVar54 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar54 + -1 + iVar48] -
                                                pfVar3[iVar53 + -1 + iVar38])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 * iVar37 + -1 + iVar38] -
                                                pfVar3[iVar43 * iVar37 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar54 + -1 + iVar48] -
                                                pfVar3[iVar53 + -1 + iVar38])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x68);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x68);
      if (((iVar59 < 1) || (iVar39 < 1)) ||
         ((iimage->height < iVar36 || (iVar48 = iVar2 + iVar39, iVar23 < iVar48)))) {
        haarXY(iimage,iVar59,iVar39,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar39 + -1 + scale;
        iVar54 = iVar38 * iVar29;
        iVar55 = iVar38 * iVar19;
        fVar76 = pfVar3[iVar55 + -1 + iVar39];
        fVar80 = pfVar3[iVar54 + -1 + iVar48];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar54 + iVar43] - pfVar3[iVar55 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar55 + -1 + iVar48] -
                                                pfVar3[iVar54 + -1 + iVar39])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar37 + -1 + iVar39] -
                                                pfVar3[iVar38 * iVar37 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar55 + -1 + iVar48] -
                                                pfVar3[iVar54 + -1 + iVar39])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x6c);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x6c);
      if ((((iVar59 < 1) || (iVar40 < 1)) || (iimage->height < iVar36)) ||
         (iVar48 = iVar2 + iVar40, iVar23 < iVar48)) {
        haarXY(iimage,iVar59,iVar40,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar39 = iVar40 + -1 + scale;
        iVar55 = iVar38 * iVar29;
        iVar43 = iVar38 * iVar19;
        fVar76 = pfVar3[iVar43 + -1 + iVar40];
        fVar80 = pfVar3[iVar55 + -1 + iVar48];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar55 + iVar39] - pfVar3[iVar43 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar48] -
                                                pfVar3[iVar55 + -1 + iVar40])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar37 + -1 + iVar40] -
                                                pfVar3[iVar38 * iVar37 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar48] -
                                                pfVar3[iVar55 + -1 + iVar40])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x70);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x70);
      if (((iVar59 < 1) || (iVar41 < 1)) ||
         ((iimage->height < iVar36 || (iVar48 = iVar2 + iVar41, iVar23 < iVar48)))) {
        haarXY(iimage,iVar59,iVar41,scale,pfVar51,pfVar1);
        iVar23 = iimage->width;
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar39 = iVar41 + -1 + scale;
        iVar43 = iVar38 * iVar29;
        iVar40 = iVar38 * iVar19;
        fVar76 = pfVar3[iVar40 + -1 + iVar41];
        fVar80 = pfVar3[iVar43 + -1 + iVar48];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar39] - pfVar3[iVar40 + iVar39]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar48] -
                                                pfVar3[iVar43 + -1 + iVar41])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar37 + -1 + iVar41] -
                                                pfVar3[iVar38 * iVar37 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar48] -
                                                pfVar3[iVar43 + -1 + iVar41])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      pfVar51 = (float *)((long)pfVar45 + lVar33 + 0x74);
      pfVar1 = (float *)((long)pfVar61 + lVar33 + 0x74);
      if (((iVar59 < 1) || (iVar42 < 1)) ||
         ((iimage->height < iVar36 || (iVar48 = iVar2 + iVar42, iVar23 < iVar48)))) {
        haarXY(iimage,iVar59,iVar42,scale,pfVar51,pfVar1);
        pfVar45 = haarResponseX;
        pfVar61 = haarResponseY;
      }
      else {
        iVar23 = iimage->data_width;
        iVar38 = iVar42 + -1 + scale;
        pfVar3 = iimage->data;
        iVar40 = iVar23 * iVar29;
        iVar39 = iVar23 * iVar19;
        fVar76 = pfVar3[iVar39 + -1 + iVar42];
        fVar80 = pfVar3[iVar40 + -1 + iVar48];
        auVar63 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 + iVar38] - pfVar3[iVar39 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar39 + -1 + iVar48] -
                                                pfVar3[iVar40 + -1 + iVar42])));
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar23 * iVar37 + -1 + iVar42] -
                                                pfVar3[iVar23 * iVar37 + -1 + iVar48])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar39 + -1 + iVar48] -
                                                pfVar3[iVar40 + -1 + iVar42])));
        *pfVar51 = (fVar76 - fVar80) + auVar63._0_4_;
        *pfVar1 = auVar65._0_4_ - (fVar76 - fVar80);
      }
      auVar101 = ZEXT1664(auVar64);
      lVar33 = lVar33 + 0x18;
      bVar4 = iVar31 < 6;
      iVar31 = iVar31 + 6;
    } while (bVar4);
    lVar34 = lVar34 + 0xc0;
    bVar4 = (int)uVar22 < 10;
    uVar22 = uVar22 + 2;
  } while (bVar4);
LAB_001bbe0c:
  fVar100 = auVar101._0_4_;
  auVar99._8_4_ = 0x3effffff;
  auVar99._0_8_ = 0x3effffff3effffff;
  auVar99._12_4_ = 0x3effffff;
  auVar98._8_4_ = 0x80000000;
  auVar98._0_8_ = 0x8000000080000000;
  auVar98._12_4_ = 0x80000000;
  auVar63 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 0.5)),auVar98,0xf8);
  auVar63 = ZEXT416((uint)(fVar100 * 0.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 1.5)),auVar98,0xf8);
  auVar64 = ZEXT416((uint)(fVar100 * 1.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 2.5)),auVar98,0xf8);
  auVar65 = ZEXT416((uint)(fVar100 * 2.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 3.5)),auVar98,0xf8);
  auVar66 = ZEXT416((uint)(fVar100 * 3.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 4.5)),auVar98,0xf8);
  auVar67 = ZEXT416((uint)(fVar100 * 4.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 5.5)),auVar98,0xf8);
  auVar68 = ZEXT416((uint)(fVar100 * 5.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 6.5)),auVar98,0xf8);
  auVar69 = ZEXT416((uint)(fVar100 * 6.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 7.5)),auVar98,0xf8);
  auVar70 = ZEXT416((uint)(auVar70._0_4_ + fVar100 * 7.5));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 8.5)),auVar98,0xf8);
  auVar71 = ZEXT416((uint)(fVar100 * 8.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 9.5)),auVar98,0xf8);
  auVar72 = ZEXT416((uint)(fVar100 * 9.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 10.5)),auVar98,0xf8);
  auVar73 = ZEXT416((uint)(fVar100 * 10.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar99,ZEXT416((uint)(fVar100 * 11.5)),auVar98,0xf8);
  fVar83 = auVar65._0_4_;
  fVar77 = fVar83 + auVar64._0_4_;
  fVar5 = fVar83 + auVar63._0_4_;
  auVar65 = ZEXT416((uint)(fVar100 * 11.5 + auVar74._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  fVar100 = fVar83 - auVar63._0_4_;
  fVar76 = fVar83 - auVar64._0_4_;
  fVar80 = fVar83 - auVar66._0_4_;
  fVar6 = fVar83 - auVar67._0_4_;
  fVar7 = fVar83 - auVar68._0_4_;
  fVar83 = fVar83 - auVar69._0_4_;
  fVar95 = auVar70._0_4_;
  fVar8 = fVar95 - auVar66._0_4_;
  fVar9 = fVar95 - auVar67._0_4_;
  fVar10 = fVar95 - auVar68._0_4_;
  fVar11 = fVar95 - auVar69._0_4_;
  fVar12 = fVar95 - auVar71._0_4_;
  fVar13 = fVar95 - auVar72._0_4_;
  fVar14 = fVar95 - auVar73._0_4_;
  fVar95 = fVar95 - auVar65._0_4_;
  gauss_s1_c0[0] = expf(fVar77 * fVar77 * fVar75);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar75);
  gauss_s1_c0[2] = expf(fVar100 * fVar100 * fVar75);
  gauss_s1_c0[3] = expf(fVar76 * fVar76 * fVar75);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar80 * fVar80 * fVar75);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar75);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar75);
  gauss_s1_c0[8] = expf(fVar83 * fVar83 * fVar75);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar75);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar75);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar75);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar75);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar75);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar75);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar75);
  gauss_s1_c1[8] = expf(fVar95 * fVar95 * fVar75);
  auVar82._8_4_ = 0x7fffffff;
  auVar82._0_8_ = 0x7fffffff7fffffff;
  auVar82._12_4_ = 0x7fffffff;
  uVar24 = 0xfffffff8;
  fVar77 = 0.0;
  lVar34 = 0;
  lVar33 = 0;
  local_150 = 0;
  do {
    pfVar45 = gauss_s1_c1;
    uVar22 = (uint)uVar24;
    if (uVar22 != 7) {
      pfVar45 = gauss_s1_c0;
    }
    lVar57 = (long)local_150;
    lVar33 = (long)(int)lVar33;
    if (uVar22 == 0xfffffff8) {
      pfVar45 = gauss_s1_c1;
    }
    uVar49 = 0;
    local_150 = local_150 + 4;
    uVar44 = 0xfffffff8;
    lVar46 = (long)haarResponseX + lVar34;
    lVar32 = (long)haarResponseY + lVar34;
    do {
      pfVar61 = gauss_s1_c1;
      if (uVar44 != 7) {
        pfVar61 = gauss_s1_c0;
      }
      auVar96 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar44 == 0xfffffff8) {
        pfVar61 = gauss_s1_c1;
      }
      uVar25 = (ulong)(uVar44 >> 0x1c & 0xfffffff8);
      uVar30 = uVar49;
      lVar35 = lVar32;
      lVar58 = lVar46;
      do {
        lVar47 = 0;
        pfVar51 = (float *)((long)pfVar45 + (ulong)(uint)((int)(uVar24 >> 0x1f) << 5));
        do {
          fVar5 = pfVar61[uVar25] * *pfVar51;
          pfVar51 = pfVar51 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          auVar63 = vinsertps_avx(ZEXT416(*(uint *)(lVar35 + lVar47 * 4)),
                                  ZEXT416(*(uint *)(lVar58 + lVar47 * 4)),0x10);
          lVar47 = lVar47 + 1;
          auVar92._0_4_ = fVar5 * auVar63._0_4_;
          auVar92._4_4_ = fVar5 * auVar63._4_4_;
          auVar92._8_4_ = fVar5 * auVar63._8_4_;
          auVar92._12_4_ = fVar5 * auVar63._12_4_;
          auVar63 = vandps_avx(auVar92,auVar82);
          auVar63 = vmovlhps_avx(auVar92,auVar63);
          auVar84._0_4_ = auVar96._0_4_ + auVar63._0_4_;
          auVar84._4_4_ = auVar96._4_4_ + auVar63._4_4_;
          auVar84._8_4_ = auVar96._8_4_ + auVar63._8_4_;
          auVar84._12_4_ = auVar96._12_4_ + auVar63._12_4_;
          auVar96 = ZEXT1664(auVar84);
        } while (lVar47 != 9);
        uVar30 = uVar30 + 0x18;
        uVar25 = uVar25 + (ulong)(-1 < (int)uVar44) * 2 + -1;
        lVar58 = lVar58 + 0x60;
        lVar35 = lVar35 + 0x60;
      } while (uVar30 < uVar44 * 0x18 + 0x198);
      uVar44 = uVar44 + 5;
      uVar49 = uVar49 + 0x78;
      fVar5 = gauss_s2_arr[lVar57];
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar66 = vmulps_avx512vl(auVar84,auVar16);
      lVar57 = lVar57 + 1;
      auVar85._0_4_ = auVar66._0_4_ * auVar66._0_4_;
      auVar85._4_4_ = auVar66._4_4_ * auVar66._4_4_;
      auVar85._8_4_ = auVar66._8_4_ * auVar66._8_4_;
      auVar85._12_4_ = auVar66._12_4_ * auVar66._12_4_;
      auVar64 = vshufpd_avx(auVar66,auVar66,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar33) = auVar66;
      lVar33 = lVar33 + 4;
      lVar46 = lVar46 + 0x1e0;
      lVar32 = lVar32 + 0x1e0;
      auVar63 = vmovshdup_avx(auVar85);
      auVar65 = vfmadd231ss_fma(auVar63,auVar66,auVar66);
      auVar63 = vshufps_avx(auVar66,auVar66,0xff);
      auVar64 = vfmadd213ss_fma(auVar64,auVar64,auVar65);
      auVar63 = vfmadd213ss_fma(auVar63,auVar63,auVar64);
      fVar77 = fVar77 + auVar63._0_4_;
    } while (local_150 != (int)lVar57);
    lVar34 = lVar34 + 0x14;
    uVar24 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar77 < 0.0) {
    fVar77 = sqrtf(fVar77);
  }
  else {
    auVar63 = vsqrtss_avx(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
    fVar77 = auVar63._0_4_;
  }
  lVar34 = 0;
  auVar96 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar77)));
  do {
    auVar101 = vmulps_avx512f(auVar96,*(undefined1 (*) [64])(ipoint->descriptor + lVar34));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar34) = auVar101;
    lVar34 = lVar34 + 0x10;
  } while (lVar34 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}